

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventmultiplexer.cxx
# Opt level: O1

void __thiscall EventMultiplexer::prepareNextState(EventMultiplexer *this)

{
  pointer ppSVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  pointer ppSVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  if ((this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
      stochNextStateIsPrepared == false) {
    (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
    stochNextValue =
         (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
         stochCurrentValue;
    (this->super_StochasticEventGenerator).eventNextValue = false;
    ppSVar1 = (this->multiSources).
              super__Vector_base<StochasticEventGenerator_*,_std::allocator<StochasticEventGenerator_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    ppSVar5 = (this->multiSources).
              super__Vector_base<StochasticEventGenerator_*,_std::allocator<StochasticEventGenerator_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (this->multiMode == false) {
      uVar6 = 0;
      if (ppSVar1 == ppSVar5) {
        uVar7 = 0;
      }
      else {
        uVar8 = 0;
        uVar9 = 1;
        do {
          if (ppSVar5[uVar8] != (StochasticEventGenerator *)0x0) {
            uVar4 = (*(ppSVar5[uVar8]->super_StochasticVariable).super_StochasticProcess.
                      super_Parametric._vptr_Parametric[0xf])();
            uVar6 = (ulong)((int)uVar6 + (uVar4 & 0xff));
          }
          ppSVar5 = (this->multiSources).
                    super__Vector_base<StochasticEventGenerator_*,_std::allocator<StochasticEventGenerator_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar7 = (long)(this->multiSources).
                        super__Vector_base<StochasticEventGenerator_*,_std::allocator<StochasticEventGenerator_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar5 >> 3;
          bVar2 = uVar9 < uVar7;
          uVar8 = uVar9;
          uVar9 = (ulong)((int)uVar9 + 1);
        } while (bVar2);
      }
      if (uVar7 == uVar6) {
        (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
        stochNextValue =
             (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess
             .stochNextValue + 1.0;
        (this->super_StochasticEventGenerator).eventNextValue = true;
      }
    }
    else if (ppSVar1 != ppSVar5) {
      uVar6 = 0;
      uVar7 = 1;
      do {
        if ((ppSVar5[uVar6] != (StochasticEventGenerator *)0x0) &&
           (iVar3 = (*(ppSVar5[uVar6]->super_StochasticVariable).super_StochasticProcess.
                      super_Parametric._vptr_Parametric[0xf])(), (char)iVar3 != '\0')) {
          (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
          stochNextValue =
               (this->super_StochasticEventGenerator).super_StochasticVariable.
               super_StochasticProcess.stochNextValue + 1.0;
          (this->super_StochasticEventGenerator).eventNextValue = true;
        }
        ppSVar5 = (this->multiSources).
                  super__Vector_base<StochasticEventGenerator_*,_std::allocator<StochasticEventGenerator_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        bVar2 = uVar7 < (ulong)((long)(this->multiSources).
                                      super__Vector_base<StochasticEventGenerator_*,_std::allocator<StochasticEventGenerator_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar5 >>
                               3);
        uVar6 = uVar7;
        uVar7 = (ulong)((int)uVar7 + 1);
      } while (bVar2);
    }
    (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
    stochNextStateIsPrepared = true;
  }
  return;
}

Assistant:

void EventMultiplexer::prepareNextState()
{
    if (!stochNextStateIsPrepared) {
        stochNextValue = stochCurrentValue;
        eventNextValue = false;
        if (multiMode) {
            for (uint i=0; i<multiSources.size(); i++) {
                if (multiSources[i] && multiSources[i]->hasEvent()) {
                    stochNextValue += 1.0;
                    eventNextValue = true;
                }
            }
        } else {
            uint amount = 0;
            for (uint i=0; i<multiSources.size(); i++) {
                if (multiSources[i] && multiSources[i]->hasEvent())
                    ++amount;
            }
            if (amount == multiSources.size()) {
                stochNextValue += 1.0;
                eventNextValue = true;
            }
        }
        stochNextStateIsPrepared = true;
    }
}